

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh-utils.cpp
# Opt level: O2

void __thiscall
wasm::EHUtils::handleBlockNestedPop(EHUtils *this,Try *try_,Function *func,Module *wasm)

{
  Expression *catchBody;
  uintptr_t uVar1;
  Name *pNVar2;
  Tag *pTVar3;
  Expression **ppEVar4;
  Expression *value;
  LocalSet *left;
  Block *pBVar5;
  Expression **ppEVar6;
  LocalGet *pLVar7;
  uint uVar8;
  ulong index;
  Signature SVar9;
  optional<wasm::Type> type;
  Expression **local_58;
  Expression **popPtr;
  Index local_44;
  Builder local_40;
  Builder builder;
  bool isPopNested;
  
  popPtr = (Expression **)(this + 0x48);
  uVar8 = 0;
  local_40.wasm = (Module *)func;
  do {
    index = (ulong)uVar8;
    if (*(ulong *)(this + 0x30) <= index) {
      return;
    }
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(this + 0x28),index)
    ;
    pTVar3 = Module::getTag((Module *)func,(Name)(pNVar2->super_IString).str);
    SVar9 = HeapType::getSignature(&pTVar3->type);
    if (SVar9.params.id.id != 0) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           popPtr,index);
      catchBody = *ppEVar4;
      builder.wasm._7_1_ = '\0';
      local_58 = (Expression **)0x0;
      value = getFirstPop(catchBody,(bool *)((long)&builder.wasm + 7),&local_58);
      ppEVar4 = local_58;
      if (value == (Expression *)0x0) {
        __assert_fail("pop && \"Pop has not been found in this catch\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                      ,0x7a,"void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)")
        ;
      }
      if (builder.wasm._7_1_ == '\x01') {
        if (local_58 == (Expression **)0x0) {
          __assert_fail("popPtr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/eh-utils.cpp"
                        ,0x8e,
                        "void wasm::EHUtils::handleBlockNestedPop(Try *, Function *, Module &)");
        }
        local_44 = Builder::addVar((Function *)try_,(Type)(value->type).id);
        left = Builder::makeLocalSet(&local_40,local_44,value);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)wasm;
        pBVar5 = Builder::makeSequence(&local_40,(Expression *)left,catchBody,type);
        ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )popPtr,index);
        *ppEVar6 = (Expression *)pBVar5;
        uVar1 = (value->type).id;
        pLVar7 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        wasm = (Module *)(ulong)local_44;
        pLVar7->index = local_44;
        (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1
        ;
        *ppEVar4 = (Expression *)pLVar7;
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void handleBlockNestedPop(Try* try_, Function* func, Module& wasm) {
  Builder builder(wasm);
  for (Index i = 0; i < try_->catchTags.size(); i++) {
    Name tagName = try_->catchTags[i];
    auto* tag = wasm.getTag(tagName);
    if (tag->params() == Type::none) {
      continue;
    }

    auto* catchBody = try_->catchBodies[i];
    bool isPopNested = false;
    Expression** popPtr = nullptr;
    Expression* pop = getFirstPop(catchBody, isPopNested, popPtr);
    assert(pop && "Pop has not been found in this catch");

    // Change code like
    // (catch $e
    //   ...
    //   (block
    //     (pop i32)
    //   )
    // )
    // into
    // (catch $e
    //   (local.set $new
    //     (pop i32)
    //   )
    //   ...
    //   (block
    //     (local.get $new)
    //   )
    // )
    if (isPopNested) {
      assert(popPtr);
      Index newLocal = builder.addVar(func, pop->type);
      try_->catchBodies[i] =
        builder.makeSequence(builder.makeLocalSet(newLocal, pop), catchBody);
      *popPtr = builder.makeLocalGet(newLocal, pop->type);
    }
  }
}